

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_helper.cpp
# Opt level: O2

bool Unit_Test::verifyImage
               (Image *image,uint32_t x,uint32_t y,uint32_t width,uint32_t height,uint8_t value)

{
  uchar *puVar1;
  uint uVar2;
  uint32_t uVar3;
  imageException *this;
  uint uVar4;
  ulong uVar5;
  uint32_t uVar6;
  uchar *puVar7;
  uchar *puVar8;
  
  if ((((height == 0) || (width == 0)) || (image->_data == (uchar *)0x0)) ||
     ((image->_width < width + x || (image->_height < height + y)))) {
    this = (imageException *)__cxa_allocate_exception(0x28);
    imageException::imageException(this,"Bad input parameters in image function");
    __cxa_throw(this,&imageException::typeinfo,imageException::~imageException);
  }
  uVar2 = image->_rowSize;
  uVar4 = width * image->_colorCount;
  uVar6 = height;
  if (uVar2 == uVar4) {
    uVar3 = 1;
    if (uVar4 < 0xffffffff / height) {
      uVar6 = 1;
      uVar3 = height;
    }
    uVar4 = uVar3 * uVar4;
  }
  puVar8 = image->_data + (ulong)(image->_colorCount * x) + (ulong)(y * uVar2);
  puVar7 = puVar8 + uVar6 * uVar2;
  for (; puVar8 != puVar7; puVar8 = puVar8 + uVar2) {
    uVar5 = 0;
    while (uVar4 != uVar5) {
      puVar1 = puVar8 + uVar5;
      uVar5 = uVar5 + 1;
      if (*puVar1 != value) goto LAB_0012e20c;
    }
  }
LAB_0012e20c:
  return puVar8 == puVar7;
}

Assistant:

bool verifyImage( const PenguinV_Image::Image & image, uint32_t x, uint32_t y, uint32_t width, uint32_t height, uint8_t value )
    {
        if( image.empty() || width == 0 || height == 0 || x + width > image.width() || y + height > image.height() )
            throw imageException( "Bad input parameters in image function" );

        width = width * image.colorCount();
        Image_Function::OptimiseRoi( width, height, image );

        const uint32_t rowSize  = image.rowSize();
        const uint8_t * outputY = image.data() + y * rowSize + x * image.colorCount();
        const uint8_t * endY    = outputY + rowSize * height;

        for ( ; outputY != endY; outputY += rowSize ) {
            const uint8_t * outputX = outputY;
            const uint8_t * endX    = outputX + width;

            for( ; outputX != endX; ++outputX ) {
                if( (*outputX) != value )
                    return false;
            }
        }

        return true;
    }